

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O1

void hash_init(hash *hash,int nbuckets,hash_hash_func *hash_func,hash_cmp_func *cmp_func)

{
  avl_tree *paVar1;
  long lVar2;
  ulong uVar3;
  
  hash->nbuckets = (long)nbuckets;
  paVar1 = (avl_tree *)malloc((long)nbuckets << 4);
  hash->buckets = paVar1;
  if (nbuckets != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      avl_init((avl_tree *)((long)&hash->buckets->root + lVar2),hash);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < hash->nbuckets);
  }
  hash->hash_func = hash_func;
  hash->cmp = cmp_func;
  return;
}

Assistant:

void hash_init(struct hash *hash, int nbuckets, hash_hash_func *hash_func, hash_cmp_func *cmp_func)
{
    size_t i;
    hash->nbuckets = nbuckets;
#ifdef _HASH_TREE
    hash->buckets = (struct avl_tree *)malloc(sizeof(struct avl_tree) * hash->nbuckets);
#else
    hash->buckets = (struct list *)malloc(sizeof(struct list) * hash->nbuckets);
#endif

    IFDEF_LOCK( hash->locks = (spin_t*)malloc(sizeof(spin_t) * hash->nbuckets) );

    for (i=0;i<hash->nbuckets;++i){
#ifdef _HASH_TREE
        avl_init(hash->buckets + i, (void *)hash);
#else
        list_init(hash->buckets + i);
#endif

        IFDEF_LOCK( spin_init(hash->locks + i); );
    }

    hash->hash_func = hash_func;
    hash->cmp = cmp_func;
}